

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.cpp
# Opt level: O1

void Diligent::CopyBLASGeometryDesc
               (BottomLevelASDesc *SrcDesc,BottomLevelASDesc *DstDesc,FixedLinearAllocator *MemPool,
               BLASNameToIndex *pSrcNameToIndex,BLASNameToIndex *DstNameToIndex)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BLASTriangleDesc *pBVar3;
  BLASBoundingBoxDesc *pBVar4;
  undefined8 uVar5;
  uint uVar6;
  BLASTriangleDesc *pBVar7;
  size_t sVar8;
  __node_base_ptr p_Var9;
  BLASBoundingBoxDesc *pBVar10;
  char (*pacVar11) [31];
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  _Hash_node_base *p_Var15;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var16;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>,_bool>
  pVar17;
  char *GeoName;
  string msg;
  Char *local_80;
  string local_78;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  BottomLevelASDesc *local_48;
  FixedLinearAllocator *local_40;
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_38;
  
  local_50 = &pSrcNameToIndex->_M_h;
  local_48 = DstDesc;
  local_40 = MemPool;
  local_38 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)DstNameToIndex;
  if (SrcDesc->pTriangles == (BLASTriangleDesc *)0x0) {
    if (SrcDesc->pBoxes == (BLASBoundingBoxDesc *)0x0) {
      LogError<true,char[45]>
                (false,"CopyBLASGeometryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0xba,(char (*) [45])"Either pTriangles or pBoxes must not be null");
      return;
    }
    FixedLinearAllocator::AddSpace(MemPool,(ulong)SrcDesc->BoxCount << 4,8);
    if (SrcDesc->BoxCount != 0) {
      lVar12 = 0;
      uVar14 = 0;
      do {
        FixedLinearAllocator::AddSpaceForString
                  (MemPool,*(Char **)((long)&SrcDesc->pBoxes->GeometryName + lVar12),0);
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + 0x10;
      } while (uVar14 < SrcDesc->BoxCount);
    }
    FixedLinearAllocator::Reserve(MemPool);
    pBVar4 = SrcDesc->pBoxes;
    uVar6 = SrcDesc->BoxCount;
    sVar13 = (ulong)uVar6 << 4;
    pBVar10 = (BLASBoundingBoxDesc *)FixedLinearAllocator::Allocate(MemPool,sVar13,8);
    if ((ulong)uVar6 != 0) {
      sVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pBVar4->GeometryName + sVar8);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pBVar10->GeometryName + sVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        sVar8 = sVar8 + 0x10;
      } while (sVar13 != sVar8);
    }
    uVar6 = SrcDesc->BoxCount;
    if (uVar6 != 0) {
      lVar12 = 0;
      uVar14 = 0;
      p_Var16 = local_50;
      do {
        local_80 = FixedLinearAllocator::CopyString
                             (local_40,*(char **)((long)&SrcDesc->pBoxes->GeometryName + lVar12),0);
        *(Char **)((long)&pBVar10->GeometryName + lVar12) = local_80;
        if (p_Var16 ==
            (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)0x0) {
          local_78._M_dataplus._M_p._4_4_ = 0xffffffff;
        }
        else {
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_78,local_80,false);
          pacVar11 = (char (*) [31])(local_78._M_string_length & 0x7fffffffffffffff);
          p_Var9 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             (p_Var16,(ulong)pacVar11 % p_Var16->_M_bucket_count,
                              (key_type *)&local_78,(__hash_code)pacVar11);
          if (p_Var9 == (__node_base_ptr)0x0) {
            p_Var15 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var15 = p_Var9->_M_nxt;
          }
          if (((void *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
               (void *)0x0) && ((long)local_78._M_string_length < 0)) {
            operator_delete__((void *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                               local_78._M_dataplus._M_p._0_4_));
          }
          if (p_Var15 == (_Hash_node_base *)0x0) {
            FormatString<char[26],char[31]>
                      (&local_78,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"iter != pSrcNameToIndex->end()",pacVar11);
            DebugAssertionFailed
                      ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                        local_78._M_dataplus._M_p._0_4_),"CopyBLASGeometryDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                       ,0xaa);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                       local_78._M_dataplus._M_p._0_4_),
                              local_78.field_2._M_allocated_capacity + 1);
            }
          }
          local_78._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&p_Var15[3]._M_nxt + 4);
          p_Var16 = local_50;
        }
        local_78._M_dataplus._M_p._0_4_ = (undefined4)uVar14;
        pVar17 = std::
                 _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<char_const*&,Diligent::BLASGeomIndex>(local_38,&local_80,&local_78);
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          LogError<true,char[16],char_const*,char[16]>
                    (false,"CopyBLASGeometryDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0xb0,(char (*) [16])"Geometry name \'",&local_80,
                     (char (*) [16])"\' is not unique");
        }
        uVar14 = uVar14 + 1;
        uVar6 = SrcDesc->BoxCount;
        lVar12 = lVar12 + 0x10;
        DstDesc = local_48;
      } while (uVar14 < uVar6);
    }
    DstDesc->pBoxes = pBVar10;
    DstDesc->BoxCount = uVar6;
    DstDesc->pTriangles = (BLASTriangleDesc *)0x0;
    DstDesc->TriangleCount = 0;
  }
  else {
    FixedLinearAllocator::AddSpace(MemPool,(ulong)SrcDesc->TriangleCount * 0x18,8);
    if (SrcDesc->TriangleCount != 0) {
      lVar12 = 0;
      uVar14 = 0;
      do {
        FixedLinearAllocator::AddSpaceForString
                  (MemPool,*(Char **)((long)&SrcDesc->pTriangles->GeometryName + lVar12),0);
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + 0x18;
      } while (uVar14 < SrcDesc->TriangleCount);
    }
    FixedLinearAllocator::Reserve(MemPool);
    pBVar3 = SrcDesc->pTriangles;
    uVar6 = SrcDesc->TriangleCount;
    sVar13 = (ulong)uVar6 * 0x18;
    pBVar7 = (BLASTriangleDesc *)FixedLinearAllocator::Allocate(MemPool,sVar13,8);
    if ((ulong)uVar6 != 0) {
      sVar8 = 0;
      do {
        *(undefined8 *)((long)&pBVar7->MaxPrimitiveCount + sVar8) =
             *(undefined8 *)((long)&pBVar3->MaxPrimitiveCount + sVar8);
        puVar1 = (undefined8 *)((long)&pBVar3->GeometryName + sVar8);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pBVar7->GeometryName + sVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        sVar8 = sVar8 + 0x18;
      } while (sVar13 != sVar8);
    }
    uVar6 = SrcDesc->TriangleCount;
    if (uVar6 != 0) {
      lVar12 = 0;
      uVar14 = 0;
      p_Var16 = local_50;
      do {
        local_80 = FixedLinearAllocator::CopyString
                             (local_40,*(char **)((long)&SrcDesc->pTriangles->GeometryName + lVar12)
                              ,0);
        *(Char **)((long)&pBVar7->GeometryName + lVar12) = local_80;
        if (p_Var16 ==
            (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)0x0) {
          local_78._M_dataplus._M_p._4_4_ = 0xffffffff;
        }
        else {
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_78,local_80,false);
          pacVar11 = (char (*) [31])(local_78._M_string_length & 0x7fffffffffffffff);
          p_Var9 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             (p_Var16,(ulong)pacVar11 % p_Var16->_M_bucket_count,
                              (key_type *)&local_78,(__hash_code)pacVar11);
          if (p_Var9 == (__node_base_ptr)0x0) {
            p_Var15 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var15 = p_Var9->_M_nxt;
          }
          if (((void *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
               (void *)0x0) && ((long)local_78._M_string_length < 0)) {
            operator_delete__((void *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                               local_78._M_dataplus._M_p._0_4_));
          }
          if (p_Var15 == (_Hash_node_base *)0x0) {
            FormatString<char[26],char[31]>
                      (&local_78,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"iter != pSrcNameToIndex->end()",pacVar11);
            DebugAssertionFailed
                      ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                        local_78._M_dataplus._M_p._0_4_),"CopyBLASGeometryDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                       ,0x87);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                       local_78._M_dataplus._M_p._0_4_),
                              local_78.field_2._M_allocated_capacity + 1);
            }
          }
          local_78._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&p_Var15[3]._M_nxt + 4);
          p_Var16 = local_50;
        }
        local_78._M_dataplus._M_p._0_4_ = (undefined4)uVar14;
        pVar17 = std::
                 _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<char_const*&,Diligent::BLASGeomIndex>(local_38,&local_80,&local_78);
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          LogError<true,char[16],char_const*,char[16]>
                    (false,"CopyBLASGeometryDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x8d,(char (*) [16])"Geometry name \'",&local_80,
                     (char (*) [16])"\' is not unique");
        }
        uVar14 = uVar14 + 1;
        uVar6 = SrcDesc->TriangleCount;
        lVar12 = lVar12 + 0x18;
        DstDesc = local_48;
      } while (uVar14 < uVar6);
    }
    DstDesc->pTriangles = pBVar7;
    DstDesc->TriangleCount = uVar6;
    DstDesc->pBoxes = (BLASBoundingBoxDesc *)0x0;
    DstDesc->BoxCount = 0;
  }
  return;
}

Assistant:

void CopyBLASGeometryDesc(const BottomLevelASDesc& SrcDesc,
                          BottomLevelASDesc&       DstDesc,
                          FixedLinearAllocator&    MemPool,
                          const BLASNameToIndex*   pSrcNameToIndex,
                          BLASNameToIndex&         DstNameToIndex) noexcept(false)
{
    if (SrcDesc.pTriangles != nullptr)
    {
        MemPool.AddSpace<decltype(*SrcDesc.pTriangles)>(SrcDesc.TriangleCount);

        for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
            MemPool.AddSpaceForString(SrcDesc.pTriangles[i].GeometryName);

        MemPool.Reserve();

        BLASTriangleDesc* pTriangles = MemPool.CopyArray(SrcDesc.pTriangles, SrcDesc.TriangleCount);

        // Copy strings
        for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
        {
            const char* GeoName        = MemPool.CopyString(SrcDesc.pTriangles[i].GeometryName);
            pTriangles[i].GeometryName = GeoName;

            Uint32 ActualIndex = INVALID_INDEX;
            if (pSrcNameToIndex)
            {
                auto iter = pSrcNameToIndex->find(GeoName);
                VERIFY_EXPR(iter != pSrcNameToIndex->end());
                ActualIndex = iter->second.ActualIndex;
            }

            bool IsUniqueName = DstNameToIndex.emplace(GeoName, BLASGeomIndex{i, ActualIndex}).second;
            if (!IsUniqueName)
                LOG_ERROR_AND_THROW("Geometry name '", GeoName, "' is not unique");
        }

        DstDesc.pTriangles    = pTriangles;
        DstDesc.TriangleCount = SrcDesc.TriangleCount;
        DstDesc.pBoxes        = nullptr;
        DstDesc.BoxCount      = 0;
    }
    else if (SrcDesc.pBoxes != nullptr)
    {
        MemPool.AddSpace<decltype(*SrcDesc.pBoxes)>(SrcDesc.BoxCount);

        for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
            MemPool.AddSpaceForString(SrcDesc.pBoxes[i].GeometryName);

        MemPool.Reserve();

        BLASBoundingBoxDesc* pBoxes = MemPool.CopyArray(SrcDesc.pBoxes, SrcDesc.BoxCount);

        // Copy strings
        for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
        {
            const char* GeoName    = MemPool.CopyString(SrcDesc.pBoxes[i].GeometryName);
            pBoxes[i].GeometryName = GeoName;

            Uint32 ActualIndex = INVALID_INDEX;
            if (pSrcNameToIndex)
            {
                auto iter = pSrcNameToIndex->find(GeoName);
                VERIFY_EXPR(iter != pSrcNameToIndex->end());
                ActualIndex = iter->second.ActualIndex;
            }

            bool IsUniqueName = DstNameToIndex.emplace(GeoName, BLASGeomIndex{i, ActualIndex}).second;
            if (!IsUniqueName)
                LOG_ERROR_AND_THROW("Geometry name '", GeoName, "' is not unique");
        }

        DstDesc.pBoxes        = pBoxes;
        DstDesc.BoxCount      = SrcDesc.BoxCount;
        DstDesc.pTriangles    = nullptr;
        DstDesc.TriangleCount = 0;
    }
    else
    {
        LOG_ERROR_AND_THROW("Either pTriangles or pBoxes must not be null");
    }
}